

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v8::detail::dragonbox::floor_log10_pow2_minus_log10_4_over_3(int e)

{
  int in_EDI;
  int shift_amount;
  uint64_t log10_4_over_3_fractional_digits;
  bool local_15;
  bool local_5;
  int local_4;
  
  local_15 = in_EDI < 0x6a5 && -0x6a5 < in_EDI;
  local_5 = local_15;
  local_4 = in_EDI;
  ignore_unused<bool,char[19]>(&local_5,(char (*) [19])"too large exponent");
  return local_4 * 0x134413 + -0x7feff >> 0x16;
}

Assistant:

inline int floor_log10_pow2_minus_log10_4_over_3(int e) FMT_NOEXCEPT {
  FMT_ASSERT(e <= 1700 && e >= -1700, "too large exponent");
  const uint64_t log10_4_over_3_fractional_digits = 0x1ffbfc2bbc780375;
  const int shift_amount = 22;
  return (e * static_cast<int>(log10_2_significand >> (64 - shift_amount)) -
          static_cast<int>(log10_4_over_3_fractional_digits >>
                           (64 - shift_amount))) >>
         shift_amount;
}